

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

int __thiscall argagg::option_result::as<int>(option_result *this,int *t)

{
  int *in_RSI;
  long *in_RDI;
  undefined4 local_4;
  
  if (*in_RDI == 0) {
    local_4 = *in_RSI;
  }
  else {
    local_4 = convert::arg<int>((char *)0x119ebb);
  }
  return local_4;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}